

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

void ggml_vec_dot_f32(int n,float *s,float *x,float *y)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [16];
  long in_RCX;
  long lVar8;
  long lVar9;
  long lVar10;
  long in_RDX;
  float *in_RSI;
  uint in_EDI;
  undefined1 auVar11 [16];
  int i_4;
  __m128 t1;
  __m128 t0;
  int i_3;
  int i_2;
  int i_1;
  int j;
  int i;
  __m256 ay [4];
  __m256 ax [4];
  __m256 sum [4];
  int np;
  ggml_float sumf;
  uint local_424;
  int local_3f4;
  int local_3f0;
  int local_3ec;
  int local_3e8;
  int local_3e4;
  undefined8 local_3e0 [16];
  undefined8 local_360 [16];
  undefined1 local_2e0 [4];
  float fStack_2dc;
  undefined8 uStack_2d8;
  float afStack_2d0 [2];
  undefined8 uStack_2c8;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  uint local_25c;
  undefined8 local_258;
  long local_250;
  long local_248;
  float *local_240;
  uint local_234;
  undefined8 *local_230;
  undefined8 *local_228;
  float local_1f0;
  undefined1 local_1e0 [32];
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  float local_160;
  float fStack_15c;
  float fStack_158;
  float fStack_154;
  float local_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  
  local_258 = 0;
  local_25c = in_EDI & 0xffffffe0;
  auVar11 = ZEXT816(0) << 0x40;
  local_280 = ZEXT1632(auVar11);
  local_2a0 = ZEXT1632(auVar11);
  local_2c0 = ZEXT1632(auVar11);
  local_1e0 = ZEXT432(0) << 0x40;
  _local_2e0 = ZEXT432(0) << 0x40;
  local_250 = in_RCX;
  local_248 = in_RDX;
  local_240 = in_RSI;
  local_234 = in_EDI;
  for (local_3e4 = 0; local_3e4 < (int)local_25c; local_3e4 = local_3e4 + 0x20) {
    for (local_3e8 = 0; local_3e8 < 4; local_3e8 = local_3e8 + 1) {
      local_228 = (undefined8 *)(local_248 + (long)local_3e4 * 4 + (long)(local_3e8 << 3) * 4);
      uVar1 = local_228[1];
      uVar2 = local_228[2];
      uVar3 = local_228[3];
      lVar8 = (long)local_3e8;
      local_360[lVar8 * 4] = *local_228;
      local_360[lVar8 * 4 + 1] = uVar1;
      local_360[lVar8 * 4 + 2] = uVar2;
      local_360[lVar8 * 4 + 3] = uVar3;
      local_230 = (undefined8 *)(local_250 + (long)local_3e4 * 4 + (long)(local_3e8 << 3) * 4);
      uVar1 = local_230[1];
      uVar2 = local_230[2];
      uVar3 = local_230[3];
      lVar8 = (long)local_3e8;
      local_3e0[lVar8 * 4] = *local_230;
      local_3e0[lVar8 * 4 + 1] = uVar1;
      local_3e0[lVar8 * 4 + 2] = uVar2;
      local_3e0[lVar8 * 4 + 3] = uVar3;
      lVar8 = (long)local_3e8;
      lVar9 = (long)local_3e8;
      lVar10 = (long)local_3e8 * 0x20;
      local_180 = local_360[lVar8 * 4];
      uStack_178 = local_360[lVar8 * 4 + 1];
      uStack_170 = local_360[lVar8 * 4 + 2];
      uStack_168 = local_360[lVar8 * 4 + 3];
      local_1a0 = local_3e0[lVar9 * 4];
      uStack_198 = local_3e0[lVar9 * 4 + 1];
      uStack_190 = local_3e0[lVar9 * 4 + 2];
      uStack_188 = local_3e0[lVar9 * 4 + 3];
      local_1c0 = *(undefined8 *)(local_2e0 + lVar10);
      uStack_1b8 = *(undefined8 *)(local_2e0 + lVar10 + 8);
      uStack_1b0 = *(undefined8 *)(local_2e0 + lVar10 + 0x10);
      uStack_1a8 = *(undefined8 *)(local_2c0 + lVar10 + -8);
      auVar6._8_8_ = local_360[lVar8 * 4 + 1];
      auVar6._0_8_ = local_360[lVar8 * 4];
      auVar6._16_8_ = local_360[lVar8 * 4 + 2];
      auVar6._24_8_ = local_360[lVar8 * 4 + 3];
      auVar5._8_8_ = local_3e0[lVar9 * 4 + 1];
      auVar5._0_8_ = local_3e0[lVar9 * 4];
      auVar5._16_8_ = local_3e0[lVar9 * 4 + 2];
      auVar5._24_8_ = local_3e0[lVar9 * 4 + 3];
      auVar4._8_8_ = *(undefined8 *)(local_2e0 + lVar10 + 8);
      auVar4._0_8_ = *(undefined8 *)(local_2e0 + lVar10);
      auVar4._16_8_ = *(undefined8 *)(local_2e0 + lVar10 + 0x10);
      auVar4._24_8_ = *(undefined8 *)(local_2c0 + lVar10 + -8);
      auVar11 = vfmadd213ps_fma(auVar5,auVar6,auVar4);
      *(undefined1 (*) [32])(local_2e0 + (long)local_3e8 * 0x20) = ZEXT1632(auVar11);
    }
  }
  for (local_3ec = 0; local_3ec < 2; local_3ec = local_3ec + 1) {
    lVar8 = (long)(local_3ec << 1) * 0x20;
    local_a0 = *(undefined8 *)(local_2e0 + lVar8);
    uStack_98 = *(undefined8 *)(local_2e0 + lVar8 + 8);
    uStack_90 = *(undefined8 *)(local_2e0 + lVar8 + 0x10);
    uStack_88 = *(undefined8 *)(local_2c0 + lVar8 + -8);
    lVar8 = (long)(local_3ec * 2 + 1) * 0x20;
    local_c0 = *(undefined8 *)(local_2e0 + lVar8);
    uStack_b8 = *(undefined8 *)(local_2e0 + lVar8 + 8);
    uStack_b0 = *(undefined8 *)(local_2e0 + lVar8 + 0x10);
    uStack_a8 = *(undefined8 *)(local_2c0 + lVar8 + -8);
    local_a0._4_4_ = (float)((ulong)local_a0 >> 0x20);
    uStack_98._4_4_ = (float)((ulong)uStack_98 >> 0x20);
    uStack_90._4_4_ = (float)((ulong)uStack_90 >> 0x20);
    uStack_88._4_4_ = (float)((ulong)uStack_88 >> 0x20);
    local_c0._4_4_ = (float)((ulong)local_c0 >> 0x20);
    uStack_b8._4_4_ = (float)((ulong)uStack_b8 >> 0x20);
    uStack_b0._4_4_ = (float)((ulong)uStack_b0 >> 0x20);
    uStack_a8._4_4_ = (float)((ulong)uStack_a8 >> 0x20);
    lVar8 = (long)(local_3ec << 1) * 0x20;
    *(float *)(local_2e0 + lVar8) = (float)local_a0 + (float)local_c0;
    *(float *)(local_2e0 + lVar8 + 4) = local_a0._4_4_ + local_c0._4_4_;
    *(float *)(local_2e0 + lVar8 + 8) = (float)uStack_98 + (float)uStack_b8;
    *(float *)(local_2e0 + lVar8 + 0xc) = uStack_98._4_4_ + uStack_b8._4_4_;
    *(float *)(local_2e0 + lVar8 + 0x10) = (float)uStack_90 + (float)uStack_b0;
    *(float *)(local_2c0 + lVar8 + -0xc) = uStack_90._4_4_ + uStack_b0._4_4_;
    *(float *)(local_2c0 + lVar8 + -8) = (float)uStack_88 + (float)uStack_a8;
    *(float *)(local_2c0 + lVar8 + -4) = uStack_88._4_4_ + uStack_a8._4_4_;
  }
  for (local_3f0 = 0; local_3f0 < 1; local_3f0 = local_3f0 + 1) {
    lVar8 = (long)(local_3f0 << 2) * 0x20;
    local_e0 = *(undefined8 *)(local_2e0 + lVar8);
    uStack_d8 = *(undefined8 *)(local_2e0 + lVar8 + 8);
    uStack_d0 = *(undefined8 *)(local_2e0 + lVar8 + 0x10);
    uStack_c8 = *(undefined8 *)(local_2c0 + lVar8 + -8);
    lVar8 = (long)(local_3f0 * 4 + 2) * 0x20;
    local_100 = *(undefined8 *)(local_2e0 + lVar8);
    uStack_f8 = *(undefined8 *)(local_2e0 + lVar8 + 8);
    uStack_f0 = *(undefined8 *)(local_2e0 + lVar8 + 0x10);
    uStack_e8 = *(undefined8 *)(local_2c0 + lVar8 + -8);
    local_e0._4_4_ = (float)((ulong)local_e0 >> 0x20);
    uStack_d8._4_4_ = (float)((ulong)uStack_d8 >> 0x20);
    uStack_d0._4_4_ = (float)((ulong)uStack_d0 >> 0x20);
    uStack_c8._4_4_ = (float)((ulong)uStack_c8 >> 0x20);
    local_100._4_4_ = (float)((ulong)local_100 >> 0x20);
    uStack_f8._4_4_ = (float)((ulong)uStack_f8 >> 0x20);
    uStack_f0._4_4_ = (float)((ulong)uStack_f0 >> 0x20);
    uStack_e8._4_4_ = (float)((ulong)uStack_e8 >> 0x20);
    lVar8 = (long)(local_3f0 << 2) * 0x20;
    *(float *)(local_2e0 + lVar8) = (float)local_e0 + (float)local_100;
    *(float *)(local_2e0 + lVar8 + 4) = local_e0._4_4_ + local_100._4_4_;
    *(float *)(local_2e0 + lVar8 + 8) = (float)uStack_d8 + (float)uStack_f8;
    *(float *)(local_2e0 + lVar8 + 0xc) = uStack_d8._4_4_ + uStack_f8._4_4_;
    *(float *)(local_2e0 + lVar8 + 0x10) = (float)uStack_d0 + (float)uStack_f0;
    *(float *)(local_2c0 + lVar8 + -0xc) = uStack_d0._4_4_ + uStack_f0._4_4_;
    *(float *)(local_2c0 + lVar8 + -8) = (float)uStack_c8 + (float)uStack_e8;
    *(float *)(local_2c0 + lVar8 + -4) = uStack_c8._4_4_ + uStack_e8._4_4_;
  }
  for (local_3f4 = 0; local_3f4 < 0; local_3f4 = local_3f4 + 1) {
    lVar8 = (long)(local_3f4 << 3) * 0x20;
    local_120 = *(undefined8 *)(local_2e0 + lVar8);
    uStack_118 = *(undefined8 *)(local_2e0 + lVar8 + 8);
    uStack_110 = *(undefined8 *)(local_2e0 + lVar8 + 0x10);
    uStack_108 = *(undefined8 *)(local_2c0 + lVar8 + -8);
    lVar8 = (long)(local_3f4 * 8 + 4) * 0x20;
    local_140 = *(undefined8 *)(local_2e0 + lVar8);
    uStack_138 = *(undefined8 *)(local_2e0 + lVar8 + 8);
    uStack_130 = *(undefined8 *)(local_2e0 + lVar8 + 0x10);
    uStack_128 = *(undefined8 *)(local_2c0 + lVar8 + -8);
    local_120._4_4_ = (float)((ulong)local_120 >> 0x20);
    uStack_118._4_4_ = (float)((ulong)uStack_118 >> 0x20);
    uStack_110._4_4_ = (float)((ulong)uStack_110 >> 0x20);
    uStack_108._4_4_ = (float)((ulong)uStack_108 >> 0x20);
    local_140._4_4_ = (float)((ulong)local_140 >> 0x20);
    uStack_138._4_4_ = (float)((ulong)uStack_138 >> 0x20);
    uStack_130._4_4_ = (float)((ulong)uStack_130 >> 0x20);
    uStack_128._4_4_ = (float)((ulong)uStack_128 >> 0x20);
    lVar8 = (long)(local_3f4 << 3) * 0x20;
    *(float *)(local_2e0 + lVar8) = (float)local_120 + (float)local_140;
    *(float *)(local_2e0 + lVar8 + 4) = local_120._4_4_ + local_140._4_4_;
    *(float *)(local_2e0 + lVar8 + 8) = (float)uStack_118 + (float)uStack_138;
    *(float *)(local_2e0 + lVar8 + 0xc) = uStack_118._4_4_ + uStack_138._4_4_;
    *(float *)(local_2e0 + lVar8 + 0x10) = (float)uStack_110 + (float)uStack_130;
    *(float *)(local_2c0 + lVar8 + -0xc) = uStack_110._4_4_ + uStack_130._4_4_;
    *(float *)(local_2c0 + lVar8 + -8) = (float)uStack_108 + (float)uStack_128;
    *(float *)(local_2c0 + lVar8 + -4) = uStack_108._4_4_ + uStack_128._4_4_;
  }
  local_150 = local_2e0._16_4_;
  fStack_14c = local_2e0._20_4_;
  fStack_148 = local_2e0._24_4_;
  fStack_144 = local_2e0._28_4_;
  uVar1 = CONCAT44(fStack_14c + fStack_15c,local_150 + local_160);
  uVar2 = CONCAT44(fStack_144 + fStack_154,fStack_148 + fStack_158);
  auVar7._8_8_ = uVar2;
  auVar7._0_8_ = uVar1;
  auVar11._8_8_ = uVar2;
  auVar11._0_8_ = uVar1;
  auVar11 = vhaddps_avx(auVar7,auVar11);
  auVar11 = vhaddps_avx(auVar11,auVar11);
  local_1f0 = auVar11._0_4_;
  for (local_424 = local_25c; (int)local_424 < (int)local_234; local_424 = local_424 + 1) {
    local_1f0 = *(float *)(local_248 + (long)(int)local_424 * 4) *
                *(float *)(local_250 + (long)(int)local_424 * 4) + local_1f0;
  }
  *local_240 = local_1f0;
  return;
}

Assistant:

inline static void ggml_vec_dot_f32(const int n, float * restrict s, const float * restrict x, const float * restrict y) {
    ggml_float sumf = 0.0;

#ifdef GGML_SIMD
    const int np = (n & ~(GGML_F32_STEP - 1));

    GGML_F32_VEC sum[GGML_F32_ARR] = { GGML_F32_VEC_ZERO };

    GGML_F32_VEC ax[GGML_F32_ARR];
    GGML_F32_VEC ay[GGML_F32_ARR];

    for (int i = 0; i < np; i += GGML_F32_STEP) {
        for (int j = 0; j < GGML_F32_ARR; j++) {
            ax[j] = GGML_F32_VEC_LOAD(x + i + j*GGML_F32_EPR);
            ay[j] = GGML_F32_VEC_LOAD(y + i + j*GGML_F32_EPR);

            sum[j] = GGML_F32_VEC_FMA(sum[j], ax[j], ay[j]);
        }
    }

    // reduce sum0..sum3 to sum0
    GGML_F32_VEC_REDUCE(sumf, sum);

    // leftovers
    for (int i = np; i < n; ++i) {
        sumf += x[i]*y[i];
    }
#else
    // scalar
    for (int i = 0; i < n; ++i) {
        sumf += x[i]*y[i];
    }
#endif

    *s = sumf;
}